

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_tuple_primitive_typeSlotAt
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  ulong uVar1;
  sysbvm_tuple_t sVar2;
  size_t slotIndex;
  
  if (argumentCount != 2) {
    context = (sysbvm_context_t *)0x2;
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  if (arguments[1] == 0 || (arguments[1] & 0xf) != 0) {
    sysbvm_error_nullArgument();
  }
  uVar1 = arguments[1];
  if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
    uVar1 = *(ulong *)(uVar1 + 0x48);
    if (uVar1 == 0 || (uVar1 & 0xf) != 0) {
      slotIndex = (long)uVar1 >> 4;
    }
    else {
      slotIndex = *(size_t *)(uVar1 + 0x10);
    }
  }
  else {
    slotIndex = 0;
  }
  sVar2 = sysbvm_tuple_slotAt(context,*arguments,slotIndex);
  return sVar2;
}

Assistant:

static sysbvm_tuple_t sysbvm_tuple_primitive_typeSlotAt(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);
    if(!sysbvm_tuple_isNonNullPointer(arguments[1])) sysbvm_error_nullArgument();

    return sysbvm_tuple_slotAt(context, arguments[0], sysbvm_typeSlot_getIndex(arguments[1]));
}